

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

int ma_device__jack_buffer_size_callback(ma_jack_nframes_t frameCount,void *pUserData)

{
  int iVar1;
  ma_uint32 mVar2;
  ulong uVar3;
  void *pvVar4;
  float *pNewBuffer_1;
  size_t newBufferSize_1;
  float *pNewBuffer;
  size_t newBufferSize;
  ma_device *pDevice;
  void *pUserData_local;
  ma_jack_nframes_t frameCount_local;
  void *p_1;
  void *p;
  
  if (pUserData == (void *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x5134,"int ma_device__jack_buffer_size_callback(ma_jack_nframes_t, void *)");
  }
  if ((*(int *)((long)pUserData + 8) == 2) || (*(int *)((long)pUserData + 8) == 3)) {
    iVar1 = *(int *)((long)pUserData + 0x2bcc);
    mVar2 = ma_get_bytes_per_sample(*(ma_format *)((long)pUserData + 0x2bc8));
    uVar3 = (ulong)(frameCount * iVar1 * mVar2);
    pvVar4 = ma__malloc_from_callbacks(uVar3,(ma_allocation_callbacks *)(*pUserData + 0x20));
    if (pvVar4 == (void *)0x0) {
      return -4;
    }
    memset(pvVar4,0,uVar3);
    ma__free_from_callbacks
              (*(void **)((long)pUserData + 0x5580),(ma_allocation_callbacks *)(*pUserData + 0x20));
    *(void **)((long)pUserData + 0x5580) = pvVar4;
    *(ma_jack_nframes_t *)((long)pUserData + 0x31c) = frameCount;
  }
  if ((*(int *)((long)pUserData + 8) == 1) || (*(int *)((long)pUserData + 8) == 3)) {
    iVar1 = *(int *)((long)pUserData + 0x2f4);
    mVar2 = ma_get_bytes_per_sample(*(ma_format *)((long)pUserData + 0x2f0));
    uVar3 = (ulong)(frameCount * iVar1 * mVar2);
    pvVar4 = ma__malloc_from_callbacks(uVar3,(ma_allocation_callbacks *)(*pUserData + 0x20));
    if (pvVar4 == (void *)0x0) {
      return -4;
    }
    memset(pvVar4,0,uVar3);
    ma__free_from_callbacks
              (*(void **)((long)pUserData + 0x5578),(ma_allocation_callbacks *)(*pUserData + 0x20));
    *(void **)((long)pUserData + 0x5578) = pvVar4;
    *(ma_jack_nframes_t *)((long)pUserData + 0x31c) = frameCount;
  }
  return 0;
}

Assistant:

static int ma_device__jack_buffer_size_callback(ma_jack_nframes_t frameCount, void* pUserData)
{
    ma_device* pDevice = (ma_device*)pUserData;
    MA_ASSERT(pDevice != NULL);

    if (pDevice->type == ma_device_type_capture || pDevice->type == ma_device_type_duplex) {
        size_t newBufferSize = frameCount * (pDevice->capture.internalChannels * ma_get_bytes_per_sample(pDevice->capture.internalFormat));
        float* pNewBuffer = (float*)ma__calloc_from_callbacks(newBufferSize, &pDevice->pContext->allocationCallbacks);
        if (pNewBuffer == NULL) {
            return MA_OUT_OF_MEMORY;
        }

        ma__free_from_callbacks(pDevice->jack.pIntermediaryBufferCapture, &pDevice->pContext->allocationCallbacks);

        pDevice->jack.pIntermediaryBufferCapture = pNewBuffer;
        pDevice->playback.internalPeriodSizeInFrames = frameCount;
    }

    if (pDevice->type == ma_device_type_playback || pDevice->type == ma_device_type_duplex) {
        size_t newBufferSize = frameCount * (pDevice->playback.internalChannels * ma_get_bytes_per_sample(pDevice->playback.internalFormat));
        float* pNewBuffer = (float*)ma__calloc_from_callbacks(newBufferSize, &pDevice->pContext->allocationCallbacks);
        if (pNewBuffer == NULL) {
            return MA_OUT_OF_MEMORY;
        }

        ma__free_from_callbacks(pDevice->jack.pIntermediaryBufferPlayback, &pDevice->pContext->allocationCallbacks);

        pDevice->jack.pIntermediaryBufferPlayback = pNewBuffer;
        pDevice->playback.internalPeriodSizeInFrames = frameCount;
    }

    return 0;
}